

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<StatementBlock> __thiscall Parser::statementBlock(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<StatementBlock> pVar1;
  vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> local_30;
  
  consume(in_RSI,LeftCurly,"\'{\'");
  statements(&local_30,in_RSI);
  std::
  make_shared<StatementBlock,std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>&>
            ((vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> *)
             this);
  std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::~vector
            (&local_30);
  consume(in_RSI,RightCurly,"\'}\'");
  pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<StatementBlock>)pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<StatementBlock> Parser::statementBlock() {
    consume(TokenType::LeftCurly, "'{'");

    ptr<StatementBlock> statBlock = make<StatementBlock>(statements());

    consume(TokenType::RightCurly, "'}'");

    return statBlock;
}